

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O2

void __thiscall
ImportFragment_BadInternalFixupTargetSection_Test::ImportFragment_BadInternalFixupTargetSection_Test
          (ImportFragment_BadInternalFixupTargetSection_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_ImportFragment).super_Test._vptr_Test = (_func_int **)&PTR__ImportFragment_0022b6b0;
  in_memory_store::in_memory_store(&(this->super_ImportFragment).import_store_);
  pstore::database::database<pstore::file::in_memory>
            (&(this->super_ImportFragment).import_db_,
             &(this->super_ImportFragment).import_store_.file_,true);
  (this->super_ImportFragment).import_db_.vacuum_mode_ = disabled;
  (this->super_ImportFragment).super_Test._vptr_Test = (_func_int **)&PTR__ImportFragment_0022b640;
  return;
}

Assistant:

TEST_F (ImportFragment, BadInternalFixupTargetSection) {
    using namespace pstore::exchange::import_ns;

    // This fragment contains a text section only but it has an internal fixup that targets the
    // data section. The fragment should be rejected.
    auto const input = R"({
        "text": {
            "data":"",
            "ifixups":[ { "section":"data", "type":1, "offset":0, "addend":0 } ]
        }
    })"s;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    constexpr pstore::index::digest fragment_digest{0x11111111, 0x11111111};
    string_mapping imported_names;

    auto parser = import_fragment_parser (&transaction, &imported_names, &fragment_digest);
    parser.input (input).eof ();
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (), make_error_code (error::internal_fixup_target_not_found));
}